

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::SkipAnyJsonValue(Parser *this)

{
  int iVar1;
  bool bVar2;
  Parser *in_RSI;
  undefined8 local_58;
  size_t count;
  undefined1 local_48 [8];
  size_t fieldn_outer;
  undefined1 local_29;
  ParseDepthGuard depth_guard;
  Parser *this_local;
  CheckedError *ce;
  
  ParseDepthGuard::ParseDepthGuard((ParseDepthGuard *)&stack0xffffffffffffffd8,in_RSI);
  local_29 = 0;
  ParseDepthGuard::Check((ParseDepthGuard *)this);
  bVar2 = CheckedError::Check((CheckedError *)this);
  if (bVar2) {
    local_29 = 1;
  }
  fieldn_outer._0_4_ = (uint)bVar2;
  if ((local_29 & 1) == 0) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if ((uint)fieldn_outer == 0) {
    iVar1 = (in_RSI->super_ParserState).token_;
    if (iVar1 == 0x5b) {
      local_58 = 0;
      ParseVectorDelimiters<flatbuffers::Parser::SkipAnyJsonValue()::__1>
                (this,(size_t *)in_RSI,(Parser *)&local_58);
      fieldn_outer._0_4_ = 1;
    }
    else if (iVar1 == 0x7b) {
      local_48 = (undefined1  [8])0x0;
      ParseTableDelimiters<flatbuffers::Parser::SkipAnyJsonValue()::__0>
                (this,(size_t *)in_RSI,(StructDef *)local_48,(anon_class_8_1_8991fb9c)0x0);
      fieldn_outer._0_4_ = 1;
    }
    else {
      if (iVar1 - 0x101U < 3) {
        Next(this);
        bVar2 = CheckedError::Check((CheckedError *)this);
        fieldn_outer._0_4_ = (uint)bVar2;
        if (!bVar2) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
      }
      else {
        bVar2 = IsIdent(in_RSI,"true");
        if ((((!bVar2) && (bVar2 = IsIdent(in_RSI,"false"), !bVar2)) &&
            (bVar2 = IsIdent(in_RSI,"null"), !bVar2)) && (bVar2 = IsIdent(in_RSI,"inf"), !bVar2)) {
          TokenError(this);
          fieldn_outer._0_4_ = 1;
          goto LAB_00113796;
        }
        Next(this);
        bVar2 = CheckedError::Check((CheckedError *)this);
        fieldn_outer._0_4_ = (uint)bVar2;
        if (!bVar2) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
      }
      if ((uint)fieldn_outer == 0) {
        anon_unknown_0::NoError();
        fieldn_outer._0_4_ = 1;
      }
    }
  }
LAB_00113796:
  ParseDepthGuard::~ParseDepthGuard((ParseDepthGuard *)&stack0xffffffffffffffd8);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::SkipAnyJsonValue() {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  switch (token_) {
    case '{': {
      size_t fieldn_outer = 0;
      return ParseTableDelimiters(fieldn_outer, nullptr,
                                  [&](const std::string &, size_t &fieldn,
                                      const StructDef *) -> CheckedError {
                                    ECHECK(SkipAnyJsonValue());
                                    fieldn++;
                                    return NoError();
                                  });
    }
    case '[': {
      size_t count = 0;
      return ParseVectorDelimiters(
          count, [&](size_t &) -> CheckedError { return SkipAnyJsonValue(); });
    }
    case kTokenStringConstant:
    case kTokenIntegerConstant:
    case kTokenFloatConstant: NEXT(); break;
    default:
      if (IsIdent("true") || IsIdent("false") || IsIdent("null") ||
          IsIdent("inf")) {
        NEXT();
      } else
        return TokenError();
  }
  return NoError();
}